

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_DecAddNode(Abc_Obj_t *pObj,Vec_Int_t *vMap,Vec_Int_t *vGates,int fSkip,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  int local_44;
  int fVeryVerbose_local;
  int fSkip_local;
  Vec_Int_t *vGates_local;
  Vec_Int_t *vMap_local;
  Abc_Obj_t *pObj_local;
  
  if (fVeryVerbose != 0) {
    uVar1 = Vec_IntSize(vMap);
    uVar2 = Abc_ObjId(pObj);
    printf("%d:%d(%d) ",(ulong)uVar1,(ulong)uVar2,(ulong)(uint)(pObj->field_6).iTemp);
    Abc_ObjPrint(_stdout,pObj);
  }
  uVar1 = Abc_ObjId(pObj);
  Vec_IntPush(vMap,uVar1);
  if (fSkip == 0) {
    local_44 = Mio_GateReadValue((Mio_Gate_t *)(pObj->field_5).pData);
  }
  else {
    local_44 = -1;
  }
  Vec_IntPush(vGates,local_44);
  return;
}

Assistant:

void Sfm_DecAddNode( Abc_Obj_t * pObj, Vec_Int_t * vMap, Vec_Int_t * vGates, int fSkip, int fVeryVerbose )
{
    if ( fVeryVerbose )
        printf( "%d:%d(%d) ", Vec_IntSize(vMap), Abc_ObjId(pObj), pObj->iTemp );
    if ( fVeryVerbose )
        Abc_ObjPrint( stdout, pObj );
    Vec_IntPush( vMap, Abc_ObjId(pObj) );
    Vec_IntPush( vGates, fSkip ? -1 : Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
}